

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O1

void __thiscall
glslang::TIntermediate::pushSelector
          (TIntermediate *this,TIntermSequence *sequence,TMatrixSelector *selector,TSourceLoc *loc)

{
  TIntermediate *this_00;
  TIntermConstantUnion *local_28;
  
  local_28 = addConstantUnion(this,selector->coord1,loc,false);
  this_00 = (TIntermediate *)sequence;
  std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
            ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)sequence,
             (TIntermNode **)&local_28);
  local_28 = addConstantUnion(this_00,selector->coord2,loc,false);
  std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
            ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)sequence,
             (TIntermNode **)&local_28);
  return;
}

Assistant:

void TIntermediate::pushSelector(TIntermSequence& sequence, const TMatrixSelector& selector, const TSourceLoc& loc)
{
    TIntermConstantUnion* constIntNode = addConstantUnion(selector.coord1, loc);
    sequence.push_back(constIntNode);
    constIntNode = addConstantUnion(selector.coord2, loc);
    sequence.push_back(constIntNode);
}